

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O0

bool __thiscall cornelich::excerpt_tailer::next_index(excerpt_tailer *this)

{
  int32_t iVar1;
  char *pcVar2;
  int64_t iVar3;
  int iVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int32_t cycle;
  bool found;
  int64_t next;
  excerpt_tailer *this_local;
  
  if ((this->m_index < 0) && (to_start(this), in_RDX = extraout_RDX, this->m_index < 0)) {
    this_local._7_1_ = false;
  }
  else {
    _cycle = (char *)(this->m_index + 1);
    while (pcVar2 = index(this,_cycle,(int)in_RDX), ((ulong)pcVar2 & 1) == 0) {
      iVar3 = vanilla_chronicle_settings::entries_per_cycle(&this->m_chronicle->m_settings);
      iVar4 = (int)((long)_cycle / iVar3);
      iVar1 = vanilla_chronicle_settings::cycle_length(&this->m_chronicle->m_settings);
      iVar1 = cycle_for_now(iVar1);
      if (iVar1 < iVar4) {
        return false;
      }
      iVar3 = vanilla_chronicle_settings::entries_per_cycle(&this->m_chronicle->m_settings);
      _cycle = (char *)((iVar4 + 1) * iVar3);
      in_RDX = extraout_RDX_00;
    }
    this->m_index = (int64_t)_cycle;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool excerpt_tailer::next_index()
{
    if(m_index < 0)
    {
        to_start();
        if(m_index < 0)
            return false;
    }

    auto next = m_index + 1;
    while(true)
    {
        auto found = index(next);
        if(found)
        {
            m_index = next;
            return true;
        }

        auto cycle = static_cast<std::int32_t>(next / m_chronicle.m_settings.entries_per_cycle());
        if(cycle > cycle_for_now(m_chronicle.m_settings.cycle_length()))
            return false;
        next = (cycle + 1) * m_chronicle.m_settings.entries_per_cycle();
    }
}